

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.cc
# Opt level: O3

BIO * BIO_pop(BIO *b)

{
  BIO *pBVar1;
  
  if (b != (BIO *)0x0) {
    pBVar1 = (BIO *)b->ptr;
    b->ptr = (void *)0x0;
    return pBVar1;
  }
  return (BIO *)0x0;
}

Assistant:

BIO *BIO_pop(BIO *bio) {
  BIO *ret;

  if (bio == NULL) {
    return NULL;
  }
  ret = bio->next_bio;
  bio->next_bio = NULL;
  return ret;
}